

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

int handle_string(void *ctx,uchar *string,size_t string_length)

{
  int iVar1;
  yajl_val __ptr;
  char *pcVar2;
  yajl_val in_RDX;
  context_t *in_RSI;
  long in_RDI;
  yajl_val v;
  undefined8 in_stack_ffffffffffffffd8;
  uint local_4;
  
  __ptr = value_alloc((yajl_type)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (__ptr == (yajl_val)0x0) {
    if (*(long *)(in_RDI + 0x10) != 0) {
      snprintf(*(char **)(in_RDI + 0x10),*(size_t *)(in_RDI + 0x18),"Out of memory");
    }
    local_4 = 0;
  }
  else {
    pcVar2 = (char *)malloc((size_t)((long)&in_RDX->type + 1));
    (__ptr->u).string = pcVar2;
    if ((__ptr->u).string == (char *)0x0) {
      free(__ptr);
      if (*(long *)(in_RDI + 0x10) != 0) {
        snprintf(*(char **)(in_RDI + 0x10),*(size_t *)(in_RDI + 0x18),"Out of memory");
      }
      local_4 = 0;
    }
    else {
      memcpy((__ptr->u).string,in_RSI,(size_t)in_RDX);
      (__ptr->u).string[(long)in_RDX] = '\0';
      iVar1 = context_add_value(in_RSI,in_RDX);
      local_4 = (uint)(iVar1 == 0);
    }
  }
  return local_4;
}

Assistant:

static int handle_string (void *ctx,
                          const unsigned char *string, size_t string_length)
{
    yajl_val v;

    v = value_alloc (yajl_t_string);
    if (v == NULL)
        RETURN_ERROR ((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.string = malloc (string_length + 1);
    if (v->u.string == NULL)
    {
        free (v);
        RETURN_ERROR ((context_t *) ctx, STATUS_ABORT, "Out of memory");
    }
    memcpy(v->u.string, string, string_length);
    v->u.string[string_length] = 0;

    return ((context_add_value (ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}